

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiDockNode::~ImGuiDockNode(ImGuiDockNode *this)

{
  IM_DELETE<ImGuiTabBar>(this->TabBar);
  this->TabBar = (ImGuiTabBar *)0x0;
  this->ChildNodes[0] = (ImGuiDockNode *)0x0;
  this->ChildNodes[1] = (ImGuiDockNode *)0x0;
  ImVector<ImGuiWindow_*>::~ImVector(&this->Windows);
  return;
}

Assistant:

ImGuiDockNode::~ImGuiDockNode()
{
    IM_DELETE(TabBar);
    TabBar = NULL;
    ChildNodes[0] = ChildNodes[1] = NULL;
}